

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_0::ComputeShaderGeneratedGroup::init
          (ComputeShaderGeneratedGroup *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  TestNode *node;
  TestNode *node_00;
  TestNode *node_01;
  ComputeShaderGeneratedSeparateCase *pCVar2;
  ComputeShaderGeneratedCombinedCase *pCVar3;
  ulong extraout_RAX;
  char *pcVar4;
  ulong uVar5;
  char *pcVar6;
  bool computeIndices_00;
  char *local_4d0;
  char *local_4c0;
  undefined1 local_398 [7];
  bool computeIndices;
  string local_378;
  string local_358;
  allocator<char> local_331;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  undefined1 local_1f0 [8];
  string desc;
  string local_1b0;
  string local_190;
  allocator<char> local_169;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  string name;
  int specNdx;
  int methodNdx;
  TestCaseGroup *largeGroup;
  TestCaseGroup *combinedGroup;
  TestCaseGroup *separateGroup;
  int gridSize;
  ComputeShaderGeneratedGroup *this_local;
  
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"separate",
             "Use separate compute shaders for each buffer");
  node_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"combined",
             "Use combined compute shader for all buffers");
  node_01 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_01,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"large",
             "Draw shapes with large buffers");
  tcu::TestNode::addChild((TestNode *)this,node);
  tcu::TestNode::addChild((TestNode *)this,node_00);
  tcu::TestNode::addChild((TestNode *)this,node_01);
  pCVar2 = (ComputeShaderGeneratedSeparateCase *)operator_new(0xb8);
  ComputeShaderGeneratedSeparateCase::ComputeShaderGeneratedSeparateCase
            (pCVar2,(this->super_TestCaseGroup).m_context,"drawarrays_compute_cmd",
             "Command from compute shader",DRAWMETHOD_DRAWARRAYS,true,false,false,8,1);
  tcu::TestNode::addChild(node,(TestNode *)pCVar2);
  pCVar2 = (ComputeShaderGeneratedSeparateCase *)operator_new(0xb8);
  ComputeShaderGeneratedSeparateCase::ComputeShaderGeneratedSeparateCase
            (pCVar2,(this->super_TestCaseGroup).m_context,"drawarrays_compute_data",
             "Data from compute shader",DRAWMETHOD_DRAWARRAYS,false,true,false,8,1);
  tcu::TestNode::addChild(node,(TestNode *)pCVar2);
  pCVar2 = (ComputeShaderGeneratedSeparateCase *)operator_new(0xb8);
  ComputeShaderGeneratedSeparateCase::ComputeShaderGeneratedSeparateCase
            (pCVar2,(this->super_TestCaseGroup).m_context,"drawarrays_compute_cmd_and_data",
             "Command and data from compute shader",DRAWMETHOD_DRAWARRAYS,true,true,false,8,1);
  tcu::TestNode::addChild(node,(TestNode *)pCVar2);
  pCVar2 = (ComputeShaderGeneratedSeparateCase *)operator_new(0xb8);
  ComputeShaderGeneratedSeparateCase::ComputeShaderGeneratedSeparateCase
            (pCVar2,(this->super_TestCaseGroup).m_context,"drawelements_compute_cmd",
             "Command from compute shader",DRAWMETHOD_DRAWELEMENTS,true,false,false,8,1);
  tcu::TestNode::addChild(node,(TestNode *)pCVar2);
  pCVar2 = (ComputeShaderGeneratedSeparateCase *)operator_new(0xb8);
  ComputeShaderGeneratedSeparateCase::ComputeShaderGeneratedSeparateCase
            (pCVar2,(this->super_TestCaseGroup).m_context,"drawelements_compute_data",
             "Data from compute shader",DRAWMETHOD_DRAWELEMENTS,false,true,false,8,1);
  tcu::TestNode::addChild(node,(TestNode *)pCVar2);
  pCVar2 = (ComputeShaderGeneratedSeparateCase *)operator_new(0xb8);
  ComputeShaderGeneratedSeparateCase::ComputeShaderGeneratedSeparateCase
            (pCVar2,(this->super_TestCaseGroup).m_context,"drawelements_compute_indices",
             "Indices from compute shader",DRAWMETHOD_DRAWELEMENTS,false,false,true,8,1);
  tcu::TestNode::addChild(node,(TestNode *)pCVar2);
  pCVar2 = (ComputeShaderGeneratedSeparateCase *)operator_new(0xb8);
  ComputeShaderGeneratedSeparateCase::ComputeShaderGeneratedSeparateCase
            (pCVar2,(this->super_TestCaseGroup).m_context,"drawelements_compute_cmd_and_data",
             "Command and data from compute shader",DRAWMETHOD_DRAWELEMENTS,true,true,false,8,1);
  tcu::TestNode::addChild(node,(TestNode *)pCVar2);
  pCVar2 = (ComputeShaderGeneratedSeparateCase *)operator_new(0xb8);
  ComputeShaderGeneratedSeparateCase::ComputeShaderGeneratedSeparateCase
            (pCVar2,(this->super_TestCaseGroup).m_context,"drawelements_compute_cmd_and_indices",
             "Command and indices from compute shader",DRAWMETHOD_DRAWELEMENTS,true,false,true,8,1);
  tcu::TestNode::addChild(node,(TestNode *)pCVar2);
  pCVar2 = (ComputeShaderGeneratedSeparateCase *)operator_new(0xb8);
  ComputeShaderGeneratedSeparateCase::ComputeShaderGeneratedSeparateCase
            (pCVar2,(this->super_TestCaseGroup).m_context,"drawelements_compute_data_and_indices",
             "Data and indices from compute shader",DRAWMETHOD_DRAWELEMENTS,false,true,true,8,1);
  tcu::TestNode::addChild(node,(TestNode *)pCVar2);
  pCVar2 = (ComputeShaderGeneratedSeparateCase *)operator_new(0xb8);
  ComputeShaderGeneratedSeparateCase::ComputeShaderGeneratedSeparateCase
            (pCVar2,(this->super_TestCaseGroup).m_context,
             "drawelements_compute_cmd_and_data_and_indices",
             "Command, data and indices from compute shader",DRAWMETHOD_DRAWELEMENTS,true,true,true,
             8,1);
  tcu::TestNode::addChild(node,(TestNode *)pCVar2);
  pCVar3 = (ComputeShaderGeneratedCombinedCase *)operator_new(0xa8);
  ComputeShaderGeneratedCombinedCase::ComputeShaderGeneratedCombinedCase
            (pCVar3,(this->super_TestCaseGroup).m_context,"drawarrays_compute_cmd_and_data",
             "Command and data from compute shader",DRAWMETHOD_DRAWARRAYS,true,true,false,8,1);
  tcu::TestNode::addChild(node_00,(TestNode *)pCVar3);
  pCVar3 = (ComputeShaderGeneratedCombinedCase *)operator_new(0xa8);
  ComputeShaderGeneratedCombinedCase::ComputeShaderGeneratedCombinedCase
            (pCVar3,(this->super_TestCaseGroup).m_context,"drawelements_compute_cmd_and_data",
             "Command and data from compute shader",DRAWMETHOD_DRAWELEMENTS,true,true,false,8,1);
  tcu::TestNode::addChild(node_00,(TestNode *)pCVar3);
  pCVar3 = (ComputeShaderGeneratedCombinedCase *)operator_new(0xa8);
  ComputeShaderGeneratedCombinedCase::ComputeShaderGeneratedCombinedCase
            (pCVar3,(this->super_TestCaseGroup).m_context,"drawelements_compute_cmd_and_indices",
             "Command and indices from compute shader",DRAWMETHOD_DRAWELEMENTS,true,false,true,8,1);
  tcu::TestNode::addChild(node_00,(TestNode *)pCVar3);
  pCVar3 = (ComputeShaderGeneratedCombinedCase *)operator_new(0xa8);
  ComputeShaderGeneratedCombinedCase::ComputeShaderGeneratedCombinedCase
            (pCVar3,(this->super_TestCaseGroup).m_context,"drawelements_compute_data_and_indices",
             "Data and indices from compute shader",DRAWMETHOD_DRAWELEMENTS,false,true,true,8,1);
  tcu::TestNode::addChild(node_00,(TestNode *)pCVar3);
  pCVar3 = (ComputeShaderGeneratedCombinedCase *)operator_new(0xa8);
  ComputeShaderGeneratedCombinedCase::ComputeShaderGeneratedCombinedCase
            (pCVar3,(this->super_TestCaseGroup).m_context,
             "drawelements_compute_cmd_and_data_and_indices",
             "Command, data and indices from compute shader",DRAWMETHOD_DRAWELEMENTS,true,true,true,
             8,1);
  tcu::TestNode::addChild(node_00,(TestNode *)pCVar3);
  name.field_2._12_4_ = 0;
  uVar5 = extraout_RAX;
  while ((int)name.field_2._12_4_ < 4) {
    for (name.field_2._8_4_ = 0; (int)name.field_2._8_4_ < 0x10;
        name.field_2._8_4_ = name.field_2._8_4_ + 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"",&local_169);
      pcVar6 = "drawelements";
      if (init::methods[(int)name.field_2._12_4_].method == DRAWMETHOD_DRAWARRAYS) {
        pcVar6 = "drawarrays";
      }
      std::operator+(&local_148,&local_168,pcVar6);
      if ((init::methods[(int)name.field_2._12_4_].separateCompute & 1U) == 0) {
        local_4c0 = "_combined";
      }
      else {
        local_4c0 = "_separate";
      }
      std::operator+(&local_128,&local_148,local_4c0);
      std::operator+(&local_108,&local_128,"_grid_");
      de::toString<int>(&local_190,&init::specs[(int)name.field_2._8_4_].gridSize);
      std::operator+(&local_e8,&local_108,&local_190);
      std::operator+(&local_c8,&local_e8,"x");
      de::toString<int>(&local_1b0,&init::specs[(int)name.field_2._8_4_].gridSize);
      std::operator+(&local_a8,&local_c8,&local_1b0);
      std::operator+(&local_88,&local_a8,"_drawcount_");
      de::toString<int>((string *)((long)&desc.field_2 + 8),
                        &init::specs[(int)name.field_2._8_4_].numDrawCommands);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                     &local_88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&desc.field_2 + 8));
      std::__cxx11::string::~string((string *)(desc.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_168);
      std::allocator<char>::~allocator(&local_169);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_330,"Draw grid with ",&local_331);
      pcVar6 = "drawelements indirect";
      if (init::methods[(int)name.field_2._12_4_].method == DRAWMETHOD_DRAWARRAYS) {
        pcVar6 = "drawarrays indirect";
      }
      std::operator+(&local_310,&local_330,pcVar6);
      std::operator+(&local_2f0,&local_310," calculating buffers in ");
      if ((init::methods[(int)name.field_2._12_4_].separateCompute & 1U) == 0) {
        local_4d0 = "combined";
      }
      else {
        local_4d0 = "separate";
      }
      std::operator+(&local_2d0,&local_2f0,local_4d0);
      std::operator+(&local_2b0,&local_2d0," compute shader.");
      std::operator+(&local_290,&local_2b0," Grid size is ");
      de::toString<int>(&local_358,&init::specs[(int)name.field_2._8_4_].gridSize);
      std::operator+(&local_270,&local_290,&local_358);
      std::operator+(&local_250,&local_270,"x");
      de::toString<int>(&local_378,&init::specs[(int)name.field_2._8_4_].gridSize);
      std::operator+(&local_230,&local_250,&local_378);
      std::operator+(&local_210,&local_230,", draw count is ");
      de::toString<int>((string *)local_398,&init::specs[(int)name.field_2._8_4_].numDrawCommands);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,
                     &local_210,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398)
      ;
      std::__cxx11::string::~string((string *)local_398);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_378);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_358);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::~string((string *)&local_330);
      std::allocator<char>::~allocator(&local_331);
      computeIndices_00 = init::methods[(int)name.field_2._12_4_].method == DRAWMETHOD_DRAWELEMENTS;
      if ((init::methods[(int)name.field_2._12_4_].separateCompute & 1U) == 0) {
        pCVar3 = (ComputeShaderGeneratedCombinedCase *)operator_new(0xa8);
        pCVar1 = (this->super_TestCaseGroup).m_context;
        pcVar6 = (char *)std::__cxx11::string::c_str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        ComputeShaderGeneratedCombinedCase::ComputeShaderGeneratedCombinedCase
                  (pCVar3,pCVar1,pcVar6,pcVar4,init::methods[(int)name.field_2._12_4_].method,false,
                   true,computeIndices_00,init::specs[(int)name.field_2._8_4_].gridSize,
                   init::specs[(int)name.field_2._8_4_].numDrawCommands);
        tcu::TestNode::addChild(node_01,(TestNode *)pCVar3);
      }
      else {
        pCVar2 = (ComputeShaderGeneratedSeparateCase *)operator_new(0xb8);
        pCVar1 = (this->super_TestCaseGroup).m_context;
        pcVar6 = (char *)std::__cxx11::string::c_str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        ComputeShaderGeneratedSeparateCase::ComputeShaderGeneratedSeparateCase
                  (pCVar2,pCVar1,pcVar6,pcVar4,init::methods[(int)name.field_2._12_4_].method,false,
                   true,computeIndices_00,init::specs[(int)name.field_2._8_4_].gridSize,
                   init::specs[(int)name.field_2._8_4_].numDrawCommands);
        tcu::TestNode::addChild(node_01,(TestNode *)pCVar2);
      }
      std::__cxx11::string::~string((string *)local_1f0);
      std::__cxx11::string::~string((string *)local_68);
    }
    name.field_2._12_4_ = name.field_2._12_4_ + 1;
    uVar5 = (ulong)(uint)name.field_2._12_4_;
  }
  return (int)uVar5;
}

Assistant:

void ComputeShaderGeneratedGroup::init (void)
{
	const int					gridSize		= 8;
	tcu::TestCaseGroup* const	separateGroup	= new tcu::TestCaseGroup(m_testCtx, "separate", "Use separate compute shaders for each buffer");
	tcu::TestCaseGroup* const	combinedGroup	= new tcu::TestCaseGroup(m_testCtx, "combined", "Use combined compute shader for all buffers");
	tcu::TestCaseGroup* const	largeGroup		= new tcu::TestCaseGroup(m_testCtx, "large",   "Draw shapes with large buffers");

	this->addChild(separateGroup);
	this->addChild(combinedGroup);
	this->addChild(largeGroup);

	// .separate
	{
		separateGroup->addChild(new ComputeShaderGeneratedSeparateCase(m_context, "drawarrays_compute_cmd",							"Command from compute shader",						ComputeShaderGeneratedCase::DRAWMETHOD_DRAWARRAYS,		true,	false,	false,	gridSize,	1));
		separateGroup->addChild(new ComputeShaderGeneratedSeparateCase(m_context, "drawarrays_compute_data",						"Data from compute shader",							ComputeShaderGeneratedCase::DRAWMETHOD_DRAWARRAYS,		false,	true,	false,	gridSize,	1));
		separateGroup->addChild(new ComputeShaderGeneratedSeparateCase(m_context, "drawarrays_compute_cmd_and_data",				"Command and data from compute shader",				ComputeShaderGeneratedCase::DRAWMETHOD_DRAWARRAYS,		true,	true,	false,	gridSize,	1));

		separateGroup->addChild(new ComputeShaderGeneratedSeparateCase(m_context, "drawelements_compute_cmd",						"Command from compute shader",						ComputeShaderGeneratedCase::DRAWMETHOD_DRAWELEMENTS,	true,	false,	false,	gridSize,	1));
		separateGroup->addChild(new ComputeShaderGeneratedSeparateCase(m_context, "drawelements_compute_data",						"Data from compute shader",							ComputeShaderGeneratedCase::DRAWMETHOD_DRAWELEMENTS,	false,	true,	false,	gridSize,	1));
		separateGroup->addChild(new ComputeShaderGeneratedSeparateCase(m_context, "drawelements_compute_indices",					"Indices from compute shader",						ComputeShaderGeneratedCase::DRAWMETHOD_DRAWELEMENTS,	false,	false,	true,	gridSize,	1));
		separateGroup->addChild(new ComputeShaderGeneratedSeparateCase(m_context, "drawelements_compute_cmd_and_data",				"Command and data from compute shader",				ComputeShaderGeneratedCase::DRAWMETHOD_DRAWELEMENTS,	true,	true,	false,	gridSize,	1));
		separateGroup->addChild(new ComputeShaderGeneratedSeparateCase(m_context, "drawelements_compute_cmd_and_indices",			"Command and indices from compute shader",			ComputeShaderGeneratedCase::DRAWMETHOD_DRAWELEMENTS,	true,	false,	true,	gridSize,	1));
		separateGroup->addChild(new ComputeShaderGeneratedSeparateCase(m_context, "drawelements_compute_data_and_indices",			"Data and indices from compute shader",				ComputeShaderGeneratedCase::DRAWMETHOD_DRAWELEMENTS,	false,	true,	true,	gridSize,	1));
		separateGroup->addChild(new ComputeShaderGeneratedSeparateCase(m_context, "drawelements_compute_cmd_and_data_and_indices",	"Command, data and indices from compute shader",	ComputeShaderGeneratedCase::DRAWMETHOD_DRAWELEMENTS,	true,	true,	true,	gridSize,	1));
	}

	// .combined
	{
		combinedGroup->addChild(new ComputeShaderGeneratedCombinedCase(m_context, "drawarrays_compute_cmd_and_data",				"Command and data from compute shader",				ComputeShaderGeneratedCase::DRAWMETHOD_DRAWARRAYS,		true,	true,	false,	gridSize,	1));
		combinedGroup->addChild(new ComputeShaderGeneratedCombinedCase(m_context, "drawelements_compute_cmd_and_data",				"Command and data from compute shader",				ComputeShaderGeneratedCase::DRAWMETHOD_DRAWELEMENTS,	true,	true,	false,	gridSize,	1));
		combinedGroup->addChild(new ComputeShaderGeneratedCombinedCase(m_context, "drawelements_compute_cmd_and_indices",			"Command and indices from compute shader",			ComputeShaderGeneratedCase::DRAWMETHOD_DRAWELEMENTS,	true,	false,	true,	gridSize,	1));
		combinedGroup->addChild(new ComputeShaderGeneratedCombinedCase(m_context, "drawelements_compute_data_and_indices",			"Data and indices from compute shader",				ComputeShaderGeneratedCase::DRAWMETHOD_DRAWELEMENTS,	false,	true,	true,	gridSize,	1));
		combinedGroup->addChild(new ComputeShaderGeneratedCombinedCase(m_context, "drawelements_compute_cmd_and_data_and_indices",	"Command, data and indices from compute shader",	ComputeShaderGeneratedCase::DRAWMETHOD_DRAWELEMENTS,	true,	true,	true,	gridSize,	1));
	}

	// .large
	{
		struct TestSpec
		{
			int gridSize;
			int numDrawCommands;
		};
		struct TestMethod
		{
			ComputeShaderGeneratedCase::DrawMethod method;
			bool                                   separateCompute;
		};

		static const TestSpec specs[] =
		{
			{ 100,	1 },		// !< drawArrays array size ~ 1.9 MB
			{ 200,	1 },		// !< drawArrays array size ~ 7.7 MB
			{ 500,	1 },		// !< drawArrays array size ~ 48 MB
			{ 1000,	1 },		// !< drawArrays array size ~ 192 MB
			{ 1200,	1 },		// !< drawArrays array size ~ 277 MB
			{ 1500,	1 },		// !< drawArrays array size ~ 430 MB

			{ 100,	8 },		// !< drawArrays array size ~ 1.9 MB
			{ 200,	8 },		// !< drawArrays array size ~ 7.7 MB
			{ 500,	8 },		// !< drawArrays array size ~ 48 MB
			{ 1000,	8 },		// !< drawArrays array size ~ 192 MB
			{ 1200,	8 },		// !< drawArrays array size ~ 277 MB
			{ 1500,	8 },		// !< drawArrays array size ~ 430 MB

			{ 100,	200  },		// !< 50 cells per draw call
			{ 200,	800  },		// !< 50 cells per draw call
			{ 500,	2500 },		// !< 100 cells per draw call
			{ 1000,	5000 },		// !< 250 cells per draw call
		};
		static const TestMethod methods[] =
		{
			{ ComputeShaderGeneratedCase::DRAWMETHOD_DRAWARRAYS,	true	},
			{ ComputeShaderGeneratedCase::DRAWMETHOD_DRAWARRAYS,	false	},
			{ ComputeShaderGeneratedCase::DRAWMETHOD_DRAWELEMENTS,	true	},
			{ ComputeShaderGeneratedCase::DRAWMETHOD_DRAWELEMENTS,	false	},
		};

		for (int methodNdx = 0; methodNdx < DE_LENGTH_OF_ARRAY(methods); ++methodNdx)
		for (int specNdx = 0; specNdx < DE_LENGTH_OF_ARRAY(specs); ++specNdx)
		{
			const std::string name = std::string("")
									+ ((methods[methodNdx].method == ComputeShaderGeneratedCase::DRAWMETHOD_DRAWARRAYS) ? ("drawarrays") : ("drawelements"))
									+ ((methods[methodNdx].separateCompute) ? ("_separate") : ("_combined"))
									+ "_grid_" + de::toString(specs[specNdx].gridSize) + "x" + de::toString(specs[specNdx].gridSize)
									+ "_drawcount_" + de::toString(specs[specNdx].numDrawCommands);

			const std::string desc = std::string("Draw grid with ")
									+ ((methods[methodNdx].method == ComputeShaderGeneratedCase::DRAWMETHOD_DRAWARRAYS) ? ("drawarrays indirect") : ("drawelements indirect"))
									+ " calculating buffers in " + ((methods[methodNdx].separateCompute) ? ("separate") : ("combined")) + " compute shader."
									+ " Grid size is " + de::toString(specs[specNdx].gridSize) + "x" + de::toString(specs[specNdx].gridSize)
									+ ", draw count is "  + de::toString(specs[specNdx].numDrawCommands);

			const bool computeIndices = (methods[methodNdx].method == ComputeShaderGeneratedCase::DRAWMETHOD_DRAWELEMENTS);

			if (methods[methodNdx].separateCompute)
				largeGroup->addChild(new ComputeShaderGeneratedSeparateCase(m_context, name.c_str(), desc.c_str(), methods[methodNdx].method, false, true, computeIndices, specs[specNdx].gridSize, specs[specNdx].numDrawCommands));
			else
				largeGroup->addChild(new ComputeShaderGeneratedCombinedCase(m_context, name.c_str(), desc.c_str(), methods[methodNdx].method, false, true, computeIndices, specs[specNdx].gridSize, specs[specNdx].numDrawCommands));
		}
	}
}